

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5VocabCloseMethod(sqlite3_vtab_cursor *pCursor)

{
  pCursor[10].pVtab = (sqlite3_vtab *)0x0;
  sqlite3Fts5IterClose((Fts5IndexIter *)pCursor[4].pVtab);
  pCursor[4].pVtab = (sqlite3_vtab *)0x0;
  sqlite3_free(pCursor[6].pVtab);
  *(undefined4 *)&pCursor[5].pVtab = 0xffffffff;
  pCursor[6].pVtab = (sqlite3_vtab *)0x0;
  *(undefined4 *)&pCursor[3].pVtab = 0;
  sqlite3_free(pCursor[0xb].pVtab);
  pCursor[0xb].pVtab = (sqlite3_vtab *)0x0;
  pCursor[0xc].pVtab = (sqlite3_vtab *)0x0;
  sqlite3_finalize((sqlite3_stmt *)pCursor[1].pVtab);
  sqlite3_free(pCursor);
  return 0;
}

Assistant:

static int fts5VocabCloseMethod(sqlite3_vtab_cursor *pCursor){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  fts5VocabResetCursor(pCsr);
  sqlite3Fts5BufferFree(&pCsr->term);
  sqlite3_finalize(pCsr->pStmt);
  sqlite3_free(pCsr);
  return SQLITE_OK;
}